

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float *pfVar2;
  int in_ESI;
  long in_RDI;
  ImRect IVar3;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float y2;
  float x2;
  float y1;
  float x1;
  undefined4 uVar4;
  float lhs;
  float fStack_28;
  float local_24;
  float fStack_20;
  ImRect local_10;
  
  IVar3 = ImGuiWindow::Rect((ImGuiWindow *)0x231d27);
  lhs = IVar3.Min.x;
  fStack_28 = IVar3.Min.y;
  local_24 = IVar3.Max.x;
  fStack_20 = IVar3.Max.y;
  x2 = (float)*(undefined8 *)(in_RDI + 0x228);
  y1 = (float)((ulong)*(undefined8 *)(in_RDI + 0x228) >> 0x20);
  x1 = (float)*(undefined8 *)(in_RDI + 0x230);
  uVar4 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x230) >> 0x20);
  y2 = *(float *)(in_RDI + 0x44);
  pfVar2 = ImVec2::operator[]((ImVec2 *)CONCAT44(x2,y2),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar1 = *pfVar2;
  if (0.0 < fVar1) {
    if (in_ESI == 0) {
      ImMax<float>(fStack_28,(fStack_20 - y2) - fVar1);
      ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar4),x1,y1,x2,y2);
    }
    else {
      ImMax<float>(lhs,(local_24 - y2) - fVar1);
      ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar4),x1,y1,x2,y2);
    }
    return local_10;
  }
  __assert_fail("scrollbar_size > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                ,0x33a,"ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *, ImGuiAxis)");
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}